

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferOperations.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBufferOperationsViaFrambufferReadBack::getFBVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TextureBufferOperationsViaFrambufferReadBack *this)

{
  stringstream local_1a0 [8];
  stringstream strstream;
  ostream local_190;
  TextureBufferOperationsViaFrambufferReadBack *local_18;
  TextureBufferOperationsViaFrambufferReadBack *this_local;
  
  local_18 = this;
  this_local = (TextureBufferOperationsViaFrambufferReadBack *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,
                  "${VERSION}\n\nprecision highp float;\n\nin vec4 inPosition;\n\nvoid main(void)\n{\n    gl_Position = inPosition;\n}\n"
                 );
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBufferOperationsViaFrambufferReadBack::getFBVertexShaderCode() const
{
	std::stringstream strstream;

	strstream << "${VERSION}\n"
				 "\n"
				 "precision highp float;\n"
				 "\n"
				 "in vec4 inPosition;\n"
				 "\n"
				 "void main(void)\n"
				 "{\n"
				 "    gl_Position = inPosition;\n"
				 "}\n";

	return strstream.str();
}